

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
     ::set_arrays(char *arrays)

{
  byte bVar1;
  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *ppVar2;
  long lVar3;
  void *__s;
  ulong __n;
  allocator_type sal;
  new_allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
  local_21;
  
  bVar1 = -*arrays;
  __n = 0x10L << (bVar1 & 0x3f);
  ppVar2 = __gnu_cxx::
           new_allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
           ::allocate(&local_21,__n & 0xffffffffffffff0,(void *)0x0);
  lVar3 = 0xf0L << (bVar1 & 0x3f);
  *(pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> **)(arrays + 0x18)
       = ppVar2;
  __s = (void *)((long)&ppVar2[-1].first +
                (ulong)(-((int)ppVar2 + (int)lVar3 + -0x10) & 0xf) + lVar3);
  *(void **)(arrays + 0x10) = __s;
  memset(__s,0,__n);
  *(undefined1 *)(*(long *)(arrays + 0x10) + -2 + (1L << (bVar1 & 0x3f)) * 0x10) = 1;
  return;
}

Assistant:

static void set_arrays(table_arrays& arrays, allocator_type al, std::size_t,
                           std::false_type /* always allocate */) {
        using storage_traits = std::allocator_traits<allocator_type>;
        auto groups_size_index = arrays.groups_size_index;
        auto groups_size = size_policy::size(groups_size_index);

        auto sal = allocator_type(al);
        arrays.elements_ = storage_traits::allocate(sal, buffer_size(groups_size));

        /* Align arrays.groups to sizeof(group_type). table_iterator critically
         * depends on such alignment for its increment operation.
         */

        auto p = reinterpret_cast<unsigned char*>(arrays.elements() + groups_size * N - 1);
        p += (uintptr_t(sizeof(group_type)) - reinterpret_cast<uintptr_t>(p)) % sizeof(group_type);
        arrays.groups_ = group_type_pointer_traits::pointer_to(*reinterpret_cast<group_type*>(p));

        initialize_groups(arrays.groups(), groups_size,
                          is_trivially_default_constructible<group_type>{});
        arrays.groups()[groups_size - 1].set_sentinel();
    }